

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O0

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  long in_RSI;
  long in_RDI;
  double dVar4;
  int i_5;
  float norm_var_inv_1;
  float norm_var_1;
  float sqmean_1;
  float *outptr_3;
  int q_7;
  int i_4;
  float *outptr_2;
  int q_6;
  float norm_var_inv;
  float norm_var;
  int q_5;
  float sqmean;
  int i_3;
  float s_1;
  float *ptr_3;
  int q_4;
  Mat sqsum;
  int i_2;
  float mean_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  int q_1;
  float mean;
  int i;
  float s;
  float *ptr;
  int q;
  Mat sum;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  Mat *in_stack_fffffffffffffbd0;
  Mat *in_stack_fffffffffffffbd8;
  Mat *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  Mat *in_stack_fffffffffffffbf0;
  int local_388;
  Mat local_378;
  Mat *local_338;
  int local_330;
  int local_32c;
  Mat local_328;
  float *local_2e8;
  int local_2dc;
  float local_2d8;
  float local_2d4;
  int local_2d0;
  float local_2cc;
  int local_2c8;
  float local_2c4;
  Mat local_2c0;
  float *local_280;
  int local_274;
  Mat local_270;
  int local_230;
  float local_22c;
  Mat local_228;
  float *local_1e8;
  Mat local_1e0;
  float *local_1a0;
  int local_198;
  int local_194;
  Mat local_190;
  float *local_150;
  Mat local_148;
  float *local_108;
  int local_fc;
  int local_f8;
  float local_f4;
  int local_f0;
  float local_ec;
  Mat local_e8;
  float *local_a8;
  int local_9c;
  int local_98;
  Mat local_88;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  Mat::create(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8,
              (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(size_t)in_stack_fffffffffffffbd8,
              (Allocator *)in_stack_fffffffffffffbd0);
  bVar2 = Mat::empty(in_stack_fffffffffffffbd0);
  if (bVar2) {
    return -100;
  }
  Mat::Mat(in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
           (size_t)in_stack_fffffffffffffbd0,
           (Allocator *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  bVar2 = Mat::empty(in_stack_fffffffffffffbd0);
  if (bVar2) {
    local_4 = -100;
    local_98 = 1;
  }
  else {
    for (local_9c = 0; local_9c < local_34; local_9c = local_9c + 1) {
      Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      pfVar3 = Mat::operator_cast_to_float_(&local_e8);
      Mat::~Mat((Mat *)0x151818);
      local_ec = 0.0;
      for (local_f0 = 0; fVar1 = local_ec, local_f0 < local_44; local_f0 = local_f0 + 1) {
        local_ec = pfVar3[local_f0] + local_ec;
      }
      local_a8 = pfVar3;
      pfVar3 = Mat::operator[](&local_88,(long)local_9c);
      *pfVar3 = fVar1;
    }
    if (*(int *)(in_RDI + 0xbc) == 0) {
      for (local_198 = 0; local_198 < local_34; local_198 = local_198 + 1) {
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_1e0);
        Mat::~Mat((Mat *)0x151b9d);
        local_1a0 = pfVar3;
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_228);
        Mat::~Mat((Mat *)0x151be9);
        local_1e8 = pfVar3;
        pfVar3 = Mat::operator[](&local_88,(long)local_198);
        local_22c = *pfVar3 / (float)local_44;
        for (local_230 = 0; local_230 < local_44; local_230 = local_230 + 1) {
          local_1e8[local_230] = local_1a0[local_230] - local_22c;
        }
      }
    }
    else {
      local_f4 = 0.0;
      for (local_f8 = 0; local_f8 < local_34; local_f8 = local_f8 + 1) {
        pfVar3 = Mat::operator[](&local_88,(long)local_f8);
        local_f4 = *pfVar3 + local_f4;
      }
      local_f4 = local_f4 / (float)(local_34 * local_44);
      for (local_fc = 0; local_fc < local_34; local_fc = local_fc + 1) {
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_148);
        Mat::~Mat((Mat *)0x151a18);
        local_108 = pfVar3;
        Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_190);
        Mat::~Mat((Mat *)0x151a64);
        for (local_194 = 0; local_194 < local_44; local_194 = local_194 + 1) {
          pfVar3[local_194] = local_108[local_194] - local_f4;
        }
        local_150 = pfVar3;
      }
    }
    if (*(int *)(in_RDI + 0xb8) != 0) {
      Mat::Mat(in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
               (size_t)in_stack_fffffffffffffbd0,
               (Allocator *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      bVar2 = Mat::empty(in_stack_fffffffffffffbd0);
      if (bVar2) {
        local_4 = -100;
        local_98 = 1;
      }
      else {
        for (local_274 = 0; local_274 < local_34; local_274 = local_274 + 1) {
          Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_2c0);
          Mat::~Mat((Mat *)0x151dea);
          local_2c4 = 0.0;
          for (local_2c8 = 0; fVar1 = local_2c4, local_2c8 < local_44; local_2c8 = local_2c8 + 1) {
            local_2c4 = pfVar3[local_2c8] * pfVar3[local_2c8] + local_2c4;
          }
          local_280 = pfVar3;
          pfVar3 = Mat::operator[](&local_270,(long)local_274);
          *pfVar3 = fVar1;
        }
        if (*(int *)(in_RDI + 0xbc) == 0) {
          for (local_330 = 0; local_330 < local_34; local_330 = local_330 + 1) {
            Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            in_stack_fffffffffffffbd8 = (Mat *)Mat::operator_cast_to_float_(&local_378);
            Mat::~Mat((Mat *)0x152150);
            local_338 = in_stack_fffffffffffffbd8;
            in_stack_fffffffffffffbd0 = (Mat *)Mat::operator[](&local_270,(long)local_330);
            dVar4 = std::sqrt((double)(ulong)(uint)(*(float *)&in_stack_fffffffffffffbd0->data /
                                                   (float)local_44));
            fVar1 = *(float *)(in_RDI + 0xc0);
            for (local_388 = 0; local_388 < local_44; local_388 = local_388 + 1) {
              *(float *)((long)&local_338->data + (long)local_388 * 4) =
                   *(float *)((long)&local_338->data + (long)local_388 * 4) *
                   (1.0 / (SUB84(dVar4,0) + fVar1));
            }
          }
        }
        else {
          local_2cc = 0.0;
          for (local_2d0 = 0; local_2d0 < local_34; local_2d0 = local_2d0 + 1) {
            pfVar3 = Mat::operator[](&local_270,(long)local_2d0);
            local_2cc = *pfVar3 + local_2cc;
          }
          local_2cc = local_2cc / (float)(local_34 * local_44);
          dVar4 = std::sqrt((double)(ulong)(uint)local_2cc);
          local_2d4 = SUB84(dVar4,0) + *(float *)(in_RDI + 0xc0);
          local_2d8 = 1.0 / local_2d4;
          for (local_2dc = 0; local_2dc < local_34; local_2dc = local_2dc + 1) {
            Mat::channel(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            pfVar3 = Mat::operator_cast_to_float_(&local_328);
            Mat::~Mat((Mat *)0x152041);
            for (local_32c = 0; local_32c < local_44; local_32c = local_32c + 1) {
              pfVar3[local_32c] = pfVar3[local_32c] * local_2d8;
            }
            local_2e8 = pfVar3;
          }
        }
        local_98 = 0;
      }
      Mat::~Mat((Mat *)0x15229d);
      if (local_98 != 0) goto LAB_001522d1;
    }
    local_4 = 0;
    local_98 = 1;
  }
LAB_001522d1:
  Mat::~Mat((Mat *)0x1522de);
  return local_4;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = static_cast<float>(sqrt(sqmean) + eps);
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = static_cast<float>(sqrt(sqmean) + eps);
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}